

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2mid.cpp
# Opt level: O0

string * instrument_callback_abi_cxx11_
                   (string *__return_storage_ptr__,uint8_t bank_msb,uint8_t bank_lsb,
                   uint8_t instrument)

{
  mapped_type *this;
  mapped_type *pmVar1;
  ostream *poVar2;
  long lVar3;
  string local_108 [8];
  string name;
  string local_c8;
  string local_98;
  undefined1 local_78 [8];
  string si;
  string slsb;
  string smsb;
  uint8_t instrument_local;
  uint8_t bank_lsb_local;
  uint8_t bank_msb_local;
  string *out;
  
  std::__cxx11::string::string((string *)(slsb.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(si.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_78);
  std::__cxx11::to_string(&local_98,(uint)bank_msb);
  std::__cxx11::string::operator=((string *)(slsb.field_2._M_local_buf + 8),(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::to_string(&local_c8,(uint)bank_lsb);
  std::__cxx11::string::operator=((string *)(si.field_2._M_local_buf + 8),(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::to_string((string *)((long)&name.field_2 + 8),(uint)instrument);
  std::__cxx11::string::operator=((string *)local_78,(string *)(name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_108);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
         ::operator[](&js_abi_cxx11_,(key_type *)((long)&slsb.field_2 + 8));
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this,(key_type *)local_78);
  std::__cxx11::string::operator=(local_108,(string *)pmVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)(slsb.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = std::operator<<(poVar2,(string *)local_78);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,local_108);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,(string *)(slsb.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,":");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_78);
  lVar3 = std::__cxx11::string::length();
  if (lVar3 != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_108);
  }
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(si.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(slsb.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string instrument_callback(uint8_t bank_msb, uint8_t bank_lsb, uint8_t instrument)
{

	std::string smsb, slsb, si;

	smsb = std::to_string((int)bank_msb);
	slsb = std::to_string((int)bank_lsb);
	si = std::to_string((int)instrument);

	std::string name;

	try
	{
		name = js[smsb][si];
		std::cout << smsb << ":" << si << " " << name << std::endl;
	}
	catch (...)
	{
		name = "";
	}

	std::string out;

	out += smsb;
	out += ":";
	out += si;
	
	if (name.length())
	{
		out += " ";
		out += name;
	}

	return out;
}